

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Orphan<capnp::compiler::ParsedFile> * __thiscall
capnp::SchemaParser::ModuleImpl::loadContent
          (Orphan<capnp::compiler::ParsedFile> *__return_storage_ptr__,ModuleImpl *this,
          Orphanage orphanage)

{
  Builder result;
  Reader statements_00;
  Builder result_00;
  ArrayPtr<const_char> input;
  char *pcVar1;
  size_t sVar2;
  Array<const_char> content;
  Builder statements;
  MallocMessageBuilder lexedBuilder;
  char *local_1f8;
  size_t sStack_1f0;
  undefined8 *local_1e8;
  PointerBuilder local_1d8;
  StructBuilder local_1c0;
  undefined1 local_198 [40];
  StructBuilder local_170;
  ListReader local_148;
  MallocMessageBuilder local_118;
  
  (*((this->file).ptr)->_vptr_SchemaFile[1])(&local_1f8);
  if ((this->lineBreaks).once.futex != 3) {
    local_118.super_MessageBuilder.arenaSpace[0] = &this->lineBreaks;
    local_118.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)&PTR_run_0064ac28;
    local_118.super_MessageBuilder.arenaSpace[1] = &local_1f8;
    kj::_::Once::runOnce
              ((Once *)local_118.super_MessageBuilder.arenaSpace[0],(Initializer *)&local_118);
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1d8,&local_118.super_MessageBuilder);
  local_198._16_8_ = local_1d8.pointer;
  local_198._0_8_ = local_1d8.segment;
  local_198._8_8_ = local_1d8.capTable;
  capnp::_::PointerBuilder::initStruct(&local_1c0,(PointerBuilder *)local_198,(StructSize)0x10000);
  input.size_ = sStack_1f0;
  input.ptr = local_1f8;
  result._builder.capTable = local_1c0.capTable;
  result._builder.segment = local_1c0.segment;
  result._builder.data = local_1c0.data;
  result._builder.pointers = local_1c0.pointers;
  result._builder.dataSize = local_1c0.dataSize;
  result._builder.pointerCount = local_1c0.pointerCount;
  result._builder._38_2_ = local_1c0._38_2_;
  capnp::compiler::lex(input,result,(ErrorReporter *)this);
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)local_198,orphanage.arena,orphanage.capTable,(StructSize)0x10000);
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_198._8_8_;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_198._16_8_;
  (__return_storage_ptr__->builder).location = (word *)local_198._24_8_;
  (__return_storage_ptr__->builder).tag.content = local_198._0_8_;
  local_1d8.segment = local_1c0.segment;
  local_1d8.capTable = local_1c0.capTable;
  local_1d8.pointer = local_1c0.pointers;
  capnp::_::PointerBuilder::getStructList
            ((ListBuilder *)local_198,&local_1d8,(StructSize)0x30002,(word *)0x0);
  capnp::_::ListBuilder::asReader(&local_148,(ListBuilder *)local_198);
  capnp::_::OrphanBuilder::asStruct(&local_170,&__return_storage_ptr__->builder,(StructSize)0x10000)
  ;
  statements_00.reader.capTable = local_148.capTable;
  statements_00.reader.segment = local_148.segment;
  statements_00.reader.ptr = local_148.ptr;
  statements_00.reader.elementCount = local_148.elementCount;
  statements_00.reader.step = local_148.step;
  statements_00.reader.structDataSize = local_148.structDataSize;
  statements_00.reader.structPointerCount = local_148.structPointerCount;
  statements_00.reader.elementSize = local_148.elementSize;
  statements_00.reader._39_1_ = local_148._39_1_;
  statements_00.reader.nestingLimit = local_148.nestingLimit;
  statements_00.reader._44_4_ = local_148._44_4_;
  result_00._builder.capTable = local_170.capTable;
  result_00._builder.segment = local_170.segment;
  result_00._builder.data = local_170.data;
  result_00._builder.pointers = local_170.pointers;
  result_00._builder.dataSize = local_170.dataSize;
  result_00._builder.pointerCount = local_170.pointerCount;
  result_00._builder._38_2_ = local_170._38_2_;
  capnp::compiler::parseFile(statements_00,result_00,(ErrorReporter *)this);
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  sVar2 = sStack_1f0;
  pcVar1 = local_1f8;
  if (local_1f8 != (char *)0x0) {
    local_1f8 = (char *)0x0;
    sStack_1f0 = 0;
    (**(code **)*local_1e8)(local_1e8,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<compiler::ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->readContent();

    lineBreaks.get([&](kj::SpaceFor<kj::Vector<uint>>& space) {
      auto vec = space.construct(content.size() / 40);
      vec->add(0);
      for (const char* pos = content.begin(); pos < content.end(); ++pos) {
        if (*pos == '\n') {
          vec->add(pos + 1 - content.begin());
        }
      }
      return vec;
    });

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<compiler::LexedStatements>();
    compiler::lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<compiler::ParsedFile>();
    compiler::parseFile(statements.getStatements(), parsed.get(), *this);
    return parsed;
  }